

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balance.hpp
# Opt level: O1

void summary_stats(Master *master)

{
  pointer ppvVar1;
  ulong uVar2;
  ulong uVar3;
  vector<WorkInfo,_std::allocator<WorkInfo>_> all_work_info;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_work;
  allocator_type local_39;
  vector<WorkInfo,_std::allocator<WorkInfo>_> local_38;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_20;
  
  local_38.super__Vector_base<WorkInfo,_std::allocator<WorkInfo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<WorkInfo,_std::allocator<WorkInfo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.super__Vector_base<WorkInfo,_std::allocator<WorkInfo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Catch::clara::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_20,
             (ulong)((long)(master->blocks_).elements_.
                           super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(master->blocks_).elements_.
                          super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3 & 0xffffffff,&local_39);
  ppvVar1 = (master->blocks_).elements_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar2 = (ulong)((long)(master->blocks_).elements_.
                        super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppvVar1) >> 3;
  if ((int)uVar2 != 0) {
    uVar3 = 0;
    do {
      local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] = *(uint *)((long)ppvVar1[uVar3] + 0xa0);
      uVar3 = uVar3 + 1;
    } while ((uVar2 & 0xffffffff) != uVar3);
  }
  gather_work_info(master,&local_20,&local_38);
  if ((master->comm_).rank_ == 0) {
    stats_work_info(master,&local_38);
  }
  if (local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38.super__Vector_base<WorkInfo,_std::allocator<WorkInfo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<WorkInfo,_std::allocator<WorkInfo>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<WorkInfo,_std::allocator<WorkInfo>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<WorkInfo,_std::allocator<WorkInfo>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void summary_stats(const diy::Master& master)
{
    std::vector<WorkInfo>  all_work_info;
    std::vector<diy::Work>      local_work(master.size());

    for (auto i = 0; i < master.size(); i++)
        local_work[i] = static_cast<Block*>(master.block(i))->work;

    gather_work_info(master, local_work, all_work_info);
    if (master.communicator().rank() == 0)
        stats_work_info(master, all_work_info);
}